

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IpxWrapper.cpp
# Opt level: O1

void reportSolveData(HighsLogOptions *log_options,Info *ipx_info)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  highsLogDev(log_options,kInfo,"\nIPX Solve data\n");
  highsLogDev(log_options,kInfo,"    IPX       status = %4d\n",
              (ulong)(uint)(ipx_info->super_ipx_info).status);
  highsLogDev(log_options,kInfo,"    IPM       status = %4d\n",
              (ulong)(uint)(ipx_info->super_ipx_info).status_ipm);
  highsLogDev(log_options,kInfo,"    Crossover status = %4d\n",
              (ulong)(uint)(ipx_info->super_ipx_info).status_crossover);
  highsLogDev(log_options,kInfo,"    IPX errflag      = %4d\n\n",
              (ulong)(uint)(ipx_info->super_ipx_info).errflag);
  highsLogDev(log_options,kInfo,"    LP variables   = %8d\n",
              (ulong)(uint)(ipx_info->super_ipx_info).num_var);
  highsLogDev(log_options,kInfo,"    LP constraints = %8d\n",
              (ulong)(uint)(ipx_info->super_ipx_info).num_constr);
  highsLogDev(log_options,kInfo,"    LP entries     = %8d\n\n",
              (ulong)(uint)(ipx_info->super_ipx_info).num_entries);
  highsLogDev(log_options,kInfo,"    Solver columns = %8d\n",
              (ulong)(uint)(ipx_info->super_ipx_info).num_cols_solver);
  highsLogDev(log_options,kInfo,"    Solver rows    = %8d\n",
              (ulong)(uint)(ipx_info->super_ipx_info).num_rows_solver);
  highsLogDev(log_options,kInfo,"    Solver entries = %8d\n\n",
              (ulong)(uint)(ipx_info->super_ipx_info).num_entries_solver);
  highsLogDev(log_options,kInfo,"    Dualized = %d\n",
              (ulong)(uint)(ipx_info->super_ipx_info).dualized);
  highsLogDev(log_options,kInfo,"    Number of dense columns detected = %d\n\n",
              (ulong)(uint)(ipx_info->super_ipx_info).dense_cols);
  highsLogDev(log_options,kInfo,"    Dependent rows    = %d\n",
              (ulong)(uint)(ipx_info->super_ipx_info).dependent_rows);
  highsLogDev(log_options,kInfo,"    Dependent cols    = %d\n",
              (ulong)(uint)(ipx_info->super_ipx_info).dependent_cols);
  highsLogDev(log_options,kInfo,"    Inconsistent rows = %d\n",
              (ulong)(uint)(ipx_info->super_ipx_info).rows_inconsistent);
  highsLogDev(log_options,kInfo,"    Inconsistent cols = %d\n",
              (ulong)(uint)(ipx_info->super_ipx_info).cols_inconsistent);
  highsLogDev(log_options,kInfo,"    Primal dropped    = %d\n",
              (ulong)(uint)(ipx_info->super_ipx_info).primal_dropped);
  highsLogDev(log_options,kInfo,"    Dual   dropped    = %d\n\n",
              (ulong)(uint)(ipx_info->super_ipx_info).dual_dropped);
  highsLogDev(log_options,kInfo,"    |Absolute primal residual| = %11.4g\n",
              (ipx_info->super_ipx_info).abs_presidual);
  highsLogDev(log_options,kInfo,"    |Absolute   dual residual| = %11.4g\n",
              (ipx_info->super_ipx_info).abs_dresidual);
  highsLogDev(log_options,kInfo,"    |Relative primal residual| = %11.4g\n",
              (ipx_info->super_ipx_info).rel_presidual);
  highsLogDev(log_options,kInfo,"    |Relative   dual residual| = %11.4g\n\n",
              (ipx_info->super_ipx_info).rel_dresidual);
  highsLogDev(log_options,kInfo,"    Primal objective value     = %11.4g\n",
              (ipx_info->super_ipx_info).pobjval);
  highsLogDev(log_options,kInfo,"    Dual   objective value     = %11.4g\n",
              (ipx_info->super_ipx_info).dobjval);
  highsLogDev(log_options,kInfo,"    Relative objective gap     = %11.4g\n",
              (ipx_info->super_ipx_info).rel_objgap);
  highsLogDev(log_options,kInfo,"    Complementarity            = %11.4g\n\n",
              (ipx_info->super_ipx_info).complementarity);
  highsLogDev(log_options,kInfo,"    |x| = %11.4g\n",(ipx_info->super_ipx_info).normx);
  highsLogDev(log_options,kInfo,"    |y| = %11.4g\n",(ipx_info->super_ipx_info).normy);
  highsLogDev(log_options,kInfo,"    |z| = %11.4g\n\n",(ipx_info->super_ipx_info).normz);
  highsLogDev(log_options,kInfo,"    Objective value       = %11.4g\n",
              (ipx_info->super_ipx_info).objval);
  highsLogDev(log_options,kInfo,"    Primal infeasibility = %11.4g\n",
              (ipx_info->super_ipx_info).primal_infeas);
  highsLogDev(log_options,kInfo,"    Dual infeasibility   = %11.4g\n\n",
              (ipx_info->super_ipx_info).dual_infeas);
  highsLogDev(log_options,kInfo,"    IPM iter   = %d\n",(ulong)(uint)(ipx_info->super_ipx_info).iter
             );
  highsLogDev(log_options,kInfo,"    KKT iter 1 = %d\n",
              (ulong)(uint)(ipx_info->super_ipx_info).kktiter1);
  highsLogDev(log_options,kInfo,"    KKT iter 2 = %d\n",
              (ulong)(uint)(ipx_info->super_ipx_info).kktiter2);
  highsLogDev(log_options,kInfo,"    Basis repairs = %d\n",
              (ulong)(uint)(ipx_info->super_ipx_info).basis_repairs);
  highsLogDev(log_options,kInfo,"    Updates start     = %d\n",
              (ulong)(uint)(ipx_info->super_ipx_info).updates_start);
  highsLogDev(log_options,kInfo,"    Updates ipm       = %d\n",
              (ulong)(uint)(ipx_info->super_ipx_info).updates_ipm);
  highsLogDev(log_options,kInfo,"    Updates crossover = %d\n\n",
              (ulong)(uint)(ipx_info->super_ipx_info).updates_crossover);
  highsLogDev(log_options,kInfo,"    Time total          = %8.2f\n\n",
              (ipx_info->super_ipx_info).time_total);
  highsLogDev(log_options,kInfo,"    Time IPM 1          = %8.2f\n",
              (ipx_info->super_ipx_info).time_ipm1);
  dVar1 = (ipx_info->super_ipx_info).time_ipm1;
  highsLogDev(log_options,kInfo,"    Time IPM 2          = %8.2f\n",
              (ipx_info->super_ipx_info).time_ipm2);
  dVar2 = (ipx_info->super_ipx_info).time_ipm2;
  highsLogDev(log_options,kInfo,"    Time starting basis = %8.2f\n",
              (ipx_info->super_ipx_info).time_starting_basis);
  dVar3 = (ipx_info->super_ipx_info).time_starting_basis;
  highsLogDev(log_options,kInfo,"    Time crossover      = %8.2f\n",
              (ipx_info->super_ipx_info).time_crossover);
  highsLogDev(log_options,kInfo,"    Sum                 = %8.2f\n\n",dVar1 + 0.0 + dVar2 + dVar3);
  highsLogDev(log_options,kInfo,"    Time kkt_factorize  = %8.2f\n",
              (ipx_info->super_ipx_info).time_kkt_factorize);
  dVar1 = (ipx_info->super_ipx_info).time_kkt_factorize;
  highsLogDev(log_options,kInfo,"    Time kkt_solve      = %8.2f\n",
              (ipx_info->super_ipx_info).time_kkt_solve);
  highsLogDev(log_options,kInfo,"    Sum                 = %8.2f\n\n",
              dVar1 + 0.0 + (ipx_info->super_ipx_info).time_kkt_solve);
  highsLogDev(log_options,kInfo,"    Time maxvol         = %8.2f\n",
              (ipx_info->super_ipx_info).time_maxvol);
  dVar1 = (ipx_info->super_ipx_info).time_maxvol;
  highsLogDev(log_options,kInfo,"    Time cr1            = %8.2f\n",
              (ipx_info->super_ipx_info).time_cr1);
  dVar2 = (ipx_info->super_ipx_info).time_cr1;
  highsLogDev(log_options,kInfo,"    Time cr2            = %8.2f\n",
              (ipx_info->super_ipx_info).time_cr2);
  highsLogDev(log_options,kInfo,"    Sum                 = %8.2f\n\n",
              dVar1 + 0.0 + dVar2 + (ipx_info->super_ipx_info).time_cr2);
  highsLogDev(log_options,kInfo,"    Time cr1_AAt        = %8.2f\n",
              (ipx_info->super_ipx_info).time_cr1_AAt);
  dVar1 = (ipx_info->super_ipx_info).time_cr1_AAt;
  highsLogDev(log_options,kInfo,"    Time cr1_pre        = %8.2f\n",
              (ipx_info->super_ipx_info).time_cr1_pre);
  highsLogDev(log_options,kInfo,"    Sum  cr1            = %8.2f\n\n",
              dVar1 + 0.0 + (ipx_info->super_ipx_info).time_cr1_pre);
  highsLogDev(log_options,kInfo,"    Time cr2_NNt        = %8.2f\n",
              (ipx_info->super_ipx_info).time_cr2_NNt);
  dVar1 = (ipx_info->super_ipx_info).time_cr2_NNt;
  highsLogDev(log_options,kInfo,"    Time cr2_B          = %8.2f\n",
              (ipx_info->super_ipx_info).time_cr2_B);
  dVar2 = (ipx_info->super_ipx_info).time_cr2_B;
  highsLogDev(log_options,kInfo,"    Time cr2_Bt         = %8.2f\n",
              (ipx_info->super_ipx_info).time_cr2_Bt);
  highsLogDev(log_options,kInfo,"    Sum  cr2            = %8.2f\n\n",
              dVar1 + 0.0 + dVar2 + (ipx_info->super_ipx_info).time_cr2_Bt);
  highsLogDev(log_options,kInfo,"    Proportion of sparse FTRAN = %11.4g\n",
              (ipx_info->super_ipx_info).ftran_sparse);
  highsLogDev(log_options,kInfo,"    Proportion of sparse BTRAN = %11.4g\n\n",
              (ipx_info->super_ipx_info).btran_sparse);
  highsLogDev(log_options,kInfo,"    Time FTRAN       = %8.2f\n",
              (ipx_info->super_ipx_info).time_ftran);
  highsLogDev(log_options,kInfo,"    Time BTRAN       = %8.2f\n",
              (ipx_info->super_ipx_info).time_btran);
  highsLogDev(log_options,kInfo,"    Time LU INVERT   = %8.2f\n",
              (ipx_info->super_ipx_info).time_lu_invert);
  highsLogDev(log_options,kInfo,"    Time LU UPDATE   = %8.2f\n",
              (ipx_info->super_ipx_info).time_lu_update);
  highsLogDev(log_options,kInfo,"    Mean fill-in     = %11.4g\n",
              (ipx_info->super_ipx_info).mean_fill);
  highsLogDev(log_options,kInfo,"    Max fill-in      = %11.4g\n",
              (ipx_info->super_ipx_info).max_fill);
  highsLogDev(log_options,kInfo,"    Time symb INVERT = %11.4g\n\n",
              (ipx_info->super_ipx_info).time_symb_invert);
  highsLogDev(log_options,kInfo,"    Maxvol updates       = %d\n",
              (ulong)(uint)(ipx_info->super_ipx_info).maxvol_updates);
  highsLogDev(log_options,kInfo,"    Maxvol skipped       = %d\n",
              (ulong)(uint)(ipx_info->super_ipx_info).maxvol_skipped);
  highsLogDev(log_options,kInfo,"    Maxvol passes        = %d\n",
              (ulong)(uint)(ipx_info->super_ipx_info).maxvol_passes);
  highsLogDev(log_options,kInfo,"    Tableau num nonzeros = %d\n",
              (ulong)(uint)(ipx_info->super_ipx_info).tbl_nnz);
  highsLogDev(log_options,kInfo,"    Tbl max?             = %11.4g\n",
              (ipx_info->super_ipx_info).tbl_max);
  highsLogDev(log_options,kInfo,"    Frobnorm squared     = %11.4g\n",
              (ipx_info->super_ipx_info).frobnorm_squared);
  highsLogDev(log_options,kInfo,"    Lambda max           = %11.4g\n",
              (ipx_info->super_ipx_info).lambdamax);
  highsLogDev(log_options,kInfo,"    Volume increase      = %11.4g\n\n",
              (ipx_info->super_ipx_info).volume_increase);
  return;
}

Assistant:

void reportSolveData(const HighsLogOptions& log_options,
                     const ipx::Info& ipx_info) {
  highsLogDev(log_options, HighsLogType::kInfo, "\nIPX Solve data\n");
  highsLogDev(log_options, HighsLogType::kInfo, "    IPX       status = %4d\n",
              (int)ipx_info.status);
  highsLogDev(log_options, HighsLogType::kInfo, "    IPM       status = %4d\n",
              (int)ipx_info.status_ipm);
  highsLogDev(log_options, HighsLogType::kInfo, "    Crossover status = %4d\n",
              (int)ipx_info.status_crossover);
  highsLogDev(log_options, HighsLogType::kInfo,
              "    IPX errflag      = %4d\n\n", (int)ipx_info.errflag);

  highsLogDev(log_options, HighsLogType::kInfo, "    LP variables   = %8d\n",
              (int)ipx_info.num_var);
  highsLogDev(log_options, HighsLogType::kInfo, "    LP constraints = %8d\n",
              (int)ipx_info.num_constr);
  highsLogDev(log_options, HighsLogType::kInfo, "    LP entries     = %8d\n\n",
              (int)ipx_info.num_entries);

  highsLogDev(log_options, HighsLogType::kInfo, "    Solver columns = %8d\n",
              (int)ipx_info.num_cols_solver);
  highsLogDev(log_options, HighsLogType::kInfo, "    Solver rows    = %8d\n",
              (int)ipx_info.num_rows_solver);
  highsLogDev(log_options, HighsLogType::kInfo, "    Solver entries = %8d\n\n",
              (int)ipx_info.num_entries_solver);

  highsLogDev(log_options, HighsLogType::kInfo, "    Dualized = %d\n",
              (int)ipx_info.dualized);
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Number of dense columns detected = %d\n\n",
              (int)ipx_info.dense_cols);

  highsLogDev(log_options, HighsLogType::kInfo, "    Dependent rows    = %d\n",
              (int)ipx_info.dependent_rows);
  highsLogDev(log_options, HighsLogType::kInfo, "    Dependent cols    = %d\n",
              (int)ipx_info.dependent_cols);
  highsLogDev(log_options, HighsLogType::kInfo, "    Inconsistent rows = %d\n",
              (int)ipx_info.rows_inconsistent);
  highsLogDev(log_options, HighsLogType::kInfo, "    Inconsistent cols = %d\n",
              (int)ipx_info.cols_inconsistent);
  highsLogDev(log_options, HighsLogType::kInfo, "    Primal dropped    = %d\n",
              (int)ipx_info.primal_dropped);
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Dual   dropped    = %d\n\n", (int)ipx_info.dual_dropped);

  highsLogDev(log_options, HighsLogType::kInfo,
              "    |Absolute primal residual| = %11.4g\n",
              ipx_info.abs_presidual);
  highsLogDev(log_options, HighsLogType::kInfo,
              "    |Absolute   dual residual| = %11.4g\n",
              ipx_info.abs_dresidual);
  highsLogDev(log_options, HighsLogType::kInfo,
              "    |Relative primal residual| = %11.4g\n",
              ipx_info.rel_presidual);
  highsLogDev(log_options, HighsLogType::kInfo,
              "    |Relative   dual residual| = %11.4g\n\n",
              ipx_info.rel_dresidual);

  highsLogDev(log_options, HighsLogType::kInfo,
              "    Primal objective value     = %11.4g\n", ipx_info.pobjval);
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Dual   objective value     = %11.4g\n", ipx_info.dobjval);
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Relative objective gap     = %11.4g\n", ipx_info.rel_objgap);
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Complementarity            = %11.4g\n\n",
              ipx_info.complementarity);

  highsLogDev(log_options, HighsLogType::kInfo, "    |x| = %11.4g\n",
              ipx_info.normx);
  highsLogDev(log_options, HighsLogType::kInfo, "    |y| = %11.4g\n",
              ipx_info.normy);
  highsLogDev(log_options, HighsLogType::kInfo, "    |z| = %11.4g\n\n",
              ipx_info.normz);

  highsLogDev(log_options, HighsLogType::kInfo,
              "    Objective value       = %11.4g\n", ipx_info.objval);
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Primal infeasibility = %11.4g\n", ipx_info.primal_infeas);
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Dual infeasibility   = %11.4g\n\n", ipx_info.dual_infeas);

  highsLogDev(log_options, HighsLogType::kInfo, "    IPM iter   = %d\n",
              (int)ipx_info.iter);
  highsLogDev(log_options, HighsLogType::kInfo, "    KKT iter 1 = %d\n",
              (int)ipx_info.kktiter1);
  highsLogDev(log_options, HighsLogType::kInfo, "    KKT iter 2 = %d\n",
              (int)ipx_info.kktiter2);
  highsLogDev(log_options, HighsLogType::kInfo, "    Basis repairs = %d\n",
              (int)ipx_info.basis_repairs);
  highsLogDev(log_options, HighsLogType::kInfo, "    Updates start     = %d\n",
              (int)ipx_info.updates_start);
  highsLogDev(log_options, HighsLogType::kInfo, "    Updates ipm       = %d\n",
              (int)ipx_info.updates_ipm);
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Updates crossover = %d\n\n",
              (int)ipx_info.updates_crossover);

  highsLogDev(log_options, HighsLogType::kInfo,
              "    Time total          = %8.2f\n\n", ipx_info.time_total);
  double sum_time = 0;
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Time IPM 1          = %8.2f\n", ipx_info.time_ipm1);
  sum_time += ipx_info.time_ipm1;
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Time IPM 2          = %8.2f\n", ipx_info.time_ipm2);
  sum_time += ipx_info.time_ipm2;
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Time starting basis = %8.2f\n",
              ipx_info.time_starting_basis);
  sum_time += ipx_info.time_starting_basis;
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Time crossover      = %8.2f\n", ipx_info.time_crossover);
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Sum                 = %8.2f\n\n", sum_time);

  sum_time = 0;
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Time kkt_factorize  = %8.2f\n", ipx_info.time_kkt_factorize);
  sum_time += ipx_info.time_kkt_factorize;
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Time kkt_solve      = %8.2f\n", ipx_info.time_kkt_solve);
  sum_time += ipx_info.time_kkt_solve;
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Sum                 = %8.2f\n\n", sum_time);

  sum_time = 0;
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Time maxvol         = %8.2f\n", ipx_info.time_maxvol);
  sum_time += ipx_info.time_maxvol;
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Time cr1            = %8.2f\n", ipx_info.time_cr1);
  sum_time += ipx_info.time_cr1;
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Time cr2            = %8.2f\n", ipx_info.time_cr2);
  sum_time += ipx_info.time_cr2;
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Sum                 = %8.2f\n\n", sum_time);

  sum_time = 0;
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Time cr1_AAt        = %8.2f\n", ipx_info.time_cr1_AAt);
  sum_time += ipx_info.time_cr1_AAt;
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Time cr1_pre        = %8.2f\n", ipx_info.time_cr1_pre);
  sum_time += ipx_info.time_cr1_pre;
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Sum  cr1            = %8.2f\n\n", sum_time);

  sum_time = 0;
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Time cr2_NNt        = %8.2f\n", ipx_info.time_cr2_NNt);
  sum_time += ipx_info.time_cr2_NNt;
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Time cr2_B          = %8.2f\n", ipx_info.time_cr2_B);
  sum_time += ipx_info.time_cr2_B;
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Time cr2_Bt         = %8.2f\n", ipx_info.time_cr2_Bt);
  sum_time += ipx_info.time_cr2_Bt;
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Sum  cr2            = %8.2f\n\n", sum_time);

  highsLogDev(log_options, HighsLogType::kInfo,
              "    Proportion of sparse FTRAN = %11.4g\n",
              ipx_info.ftran_sparse);
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Proportion of sparse BTRAN = %11.4g\n\n",
              ipx_info.btran_sparse);

  highsLogDev(log_options, HighsLogType::kInfo,
              "    Time FTRAN       = %8.2f\n", ipx_info.time_ftran);
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Time BTRAN       = %8.2f\n", ipx_info.time_btran);
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Time LU INVERT   = %8.2f\n", ipx_info.time_lu_invert);
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Time LU UPDATE   = %8.2f\n", ipx_info.time_lu_update);
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Mean fill-in     = %11.4g\n", ipx_info.mean_fill);
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Max fill-in      = %11.4g\n", ipx_info.max_fill);
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Time symb INVERT = %11.4g\n\n", ipx_info.time_symb_invert);

  highsLogDev(log_options, HighsLogType::kInfo,
              "    Maxvol updates       = %d\n", (int)ipx_info.maxvol_updates);
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Maxvol skipped       = %d\n", (int)ipx_info.maxvol_skipped);
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Maxvol passes        = %d\n", (int)ipx_info.maxvol_passes);
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Tableau num nonzeros = %d\n", (int)ipx_info.tbl_nnz);
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Tbl max?             = %11.4g\n", ipx_info.tbl_max);
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Frobnorm squared     = %11.4g\n", ipx_info.frobnorm_squared);
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Lambda max           = %11.4g\n", ipx_info.lambdamax);
  highsLogDev(log_options, HighsLogType::kInfo,
              "    Volume increase      = %11.4g\n\n",
              ipx_info.volume_increase);
}